

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

void __thiscall Store::MEM_exe(Store *this,memory *MEM,uint *reg)

{
  int iVar1;
  uint *reg_local;
  memory *MEM_local;
  Store *this_local;
  
  iVar1 = this->func3;
  if (iVar1 == 0) {
    MEM->mem[this->address] = (uchar)this->rs_data2;
  }
  else if (iVar1 == 1) {
    MEM->mem[this->address] = (uchar)this->rs_data2;
    MEM->mem[this->address + 1] = (uchar)(this->rs_data2 >> 8);
  }
  else if (iVar1 == 2) {
    MEM->mem[this->address] = (uchar)this->rs_data2;
    MEM->mem[this->address + 1] = (uchar)(this->rs_data2 >> 8);
    MEM->mem[this->address + 2] = (uchar)(this->rs_data2 >> 0x10);
    MEM->mem[this->address + 3] = (uchar)(this->rs_data2 >> 0x18);
  }
  return;
}

Assistant:

void Store::MEM_exe(memory &MEM,unsigned int *reg) {
    switch(func3){
        case 0:{
            MEM.mem[address]=rs_data2%256;
            break;
        }
        case 1:{
            MEM.mem[address]=rs_data2%256;
            MEM.mem[address+1]=(rs_data2>>8)%256;
            break;
        }
        case 2:{
            MEM.mem[address]=rs_data2%256;
            MEM.mem[address+1]=(rs_data2>>8)%256;
            MEM.mem[address+2]=(rs_data2>>16)%256;
            MEM.mem[address+3]=(rs_data2>>24)%256;
            break;
        }
    }
}